

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint aom_get_mb_ss_sse2(int16_t *src)

{
  undefined1 auVar1 [16];
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar2 [16];
  __m128i v;
  int i;
  __m128i vsum;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c0;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  
  local_d8 = 0;
  uStack_d4 = 0;
  uStack_d0 = 0;
  uStack_cc = 0;
  local_c0 = in_RDI;
  for (local_dc = 0; local_dc < 0x20; local_dc = local_dc + 1) {
    xx_loadu_128(local_c0);
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = extraout_XMM0_Qa;
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = extraout_XMM0_Qa;
    auVar2 = pmaddwd(auVar1,auVar2);
    local_68 = auVar2._0_4_;
    uStack_64 = auVar2._4_4_;
    uStack_60 = auVar2._8_4_;
    uStack_5c = auVar2._12_4_;
    local_d8 = local_d8 + local_68;
    uStack_d4 = uStack_d4 + uStack_64;
    uStack_d0 = uStack_d0 + uStack_60;
    uStack_cc = uStack_cc + uStack_5c;
    local_c0 = (void *)((long)local_c0 + 0x10);
  }
  return local_d8 + uStack_d0 + uStack_d4 + uStack_cc;
}

Assistant:

unsigned int aom_get_mb_ss_sse2(const int16_t *src) {
  __m128i vsum = _mm_setzero_si128();
  int i;

  for (i = 0; i < 32; ++i) {
    const __m128i v = xx_loadu_128(src);
    vsum = _mm_add_epi32(vsum, _mm_madd_epi16(v, v));
    src += 8;
  }

  vsum = _mm_add_epi32(vsum, _mm_srli_si128(vsum, 8));
  vsum = _mm_add_epi32(vsum, _mm_srli_si128(vsum, 4));
  return (unsigned int)_mm_cvtsi128_si32(vsum);
}